

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.cpp
# Opt level: O0

int capture(socket_base_t *capture_,msg_t *msg_,int more_)

{
  int iVar1;
  ssize_t sVar2;
  uint in_EDX;
  EVP_PKEY_CTX *src;
  void *__buf;
  EVP_PKEY_CTX *in_RSI;
  socket_base_t *in_RDI;
  int in_R8D;
  int rc;
  msg_t ctrl;
  msg_t local_60;
  uint local_1c;
  EVP_PKEY_CTX *local_18;
  socket_base_t *local_10;
  
  if (in_RDI != (socket_base_t *)0x0) {
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = zmq::msg_t::init(&local_60,in_RSI);
    if (iVar1 < 0) {
      return -1;
    }
    iVar1 = zmq::msg_t::copy(&local_60,local_18,src);
    if (iVar1 < 0) {
      return -1;
    }
    __buf = (void *)0x0;
    if (local_1c != 0) {
      __buf = (void *)0x2;
    }
    sVar2 = zmq::socket_base_t::send(local_10,(int)&local_60,__buf,(ulong)local_1c,in_R8D);
    if ((int)sVar2 < 0) {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int
capture (class zmq::socket_base_t *capture_, zmq::msg_t *msg_, int more_ = 0)
{
    //  Copy message to capture socket if any
    if (capture_) {
        zmq::msg_t ctrl;
        int rc = ctrl.init ();
        if (unlikely (rc < 0))
            return -1;
        rc = ctrl.copy (*msg_);
        if (unlikely (rc < 0))
            return -1;
        rc = capture_->send (&ctrl, more_ ? ZMQ_SNDMORE : 0);
        if (unlikely (rc < 0))
            return -1;
    }
    return 0;
}